

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  pointer pcVar1;
  cmExternalMakefileProjectGenerator *extraGenerator;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar3;
  pointer ppcVar4;
  string *globalGenerator;
  cmGlobalGenerator *this_00;
  pointer ppcVar5;
  bool bVar6;
  string name;
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  string local_b8;
  uint local_94;
  cmExternalMakefileProjectGenerator *local_90;
  long *local_88;
  long local_80;
  long local_78 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  ppcVar5 = (this->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar5 !=
      (this->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar3 = 0;
    do {
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                (&local_68,*ppcVar5);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_b8,*ppcVar5);
      local_94 = (uint)uVar3;
      if (local_b8._M_string_length == gname->_M_string_length) {
        if (local_b8._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(local_b8._M_dataplus._M_p,(gname->_M_dataplus)._M_p,local_b8._M_string_length
                      );
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      globalGenerator =
           local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (bVar6) {
        iVar2 = (*(*ppcVar5)->_vptr_cmExternalMakefileProjectGeneratorFactory[2])();
        if (local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar3 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
          _Unwind_Resume(uVar3);
        }
        local_88 = local_78;
        pcVar1 = ((local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        local_90 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var_00,iVar2);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar1,
                   pcVar1 + (local_68.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
LAB_00329ae7:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if ((local_94 & 1) == 0) goto LAB_00329b1d;
        break;
      }
      for (; globalGenerator !=
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; globalGenerator = globalGenerator + 1) {
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,*ppcVar5);
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  (&local_b8,globalGenerator,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_b8._M_string_length == gname->_M_string_length) {
          if (local_b8._M_string_length == 0) {
            bVar6 = true;
          }
          else {
            iVar2 = bcmp(local_b8._M_dataplus._M_p,(gname->_M_dataplus)._M_p,
                         local_b8._M_string_length);
            bVar6 = iVar2 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        if (bVar6) {
          iVar2 = (*(*ppcVar5)->_vptr_cmExternalMakefileProjectGeneratorFactory[2])();
          local_90 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var,iVar2);
          local_88 = local_78;
          pcVar1 = (globalGenerator->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar1,pcVar1 + globalGenerator->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (bVar6) goto LAB_00329ae7;
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      ppcVar5 = ppcVar5 + 1;
      bVar6 = ppcVar5 ==
              (this->ExtraGenerators).
              super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      uVar3 = CONCAT71((int7)((ulong)&local_68 >> 8),bVar6);
    } while (!bVar6);
  }
  local_90 = (cmExternalMakefileProjectGenerator *)0x0;
  local_88 = local_78;
  pcVar1 = (gname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + gname->_M_string_length);
LAB_00329b1d:
  extraGenerator = local_90;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_88,local_80 + (long)local_88);
  ppcVar4 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar4 ==
      (this->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (cmGlobalGenerator *)0x0;
  }
  else {
    do {
      iVar2 = (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar4,&local_b8,this);
      this_00 = (cmGlobalGenerator *)CONCAT44(extraout_var_01,iVar2);
      if ((cmGlobalGenerator *)CONCAT44(extraout_var_01,iVar2) != (cmGlobalGenerator *)0x0) break;
      ppcVar4 = ppcVar4 + 1;
      this_00 = (cmGlobalGenerator *)0x0;
    } while (ppcVar4 !=
             (this->Generators).
             super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (this_00 == (cmGlobalGenerator *)0x0) {
    if (extraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
      (*extraGenerator->_vptr_cmExternalMakefileProjectGenerator[1])(extraGenerator);
    }
  }
  else {
    cmGlobalGenerator::SetExternalMakefileProjectGenerator(this_00,extraGenerator);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return this_00;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  std::pair<cmExternalMakefileProjectGenerator*, std::string> extra =
    createExtraGenerator(this->ExtraGenerators, gname);
  cmExternalMakefileProjectGenerator* extraGenerator = extra.first;
  const std::string name = extra.second;

  cmGlobalGenerator* generator = CM_NULLPTR;
  for (RegisteredGeneratorsVector::const_iterator i = this->Generators.begin();
       i != this->Generators.end(); ++i) {
    generator = (*i)->CreateGlobalGenerator(name, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
  } else {
    delete extraGenerator;
  }

  return generator;
}